

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBooleanStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::BooleanStateQueryVerifiers::GetIntegerVerifier::verifyBoolean4
          (GetIntegerVerifier *this,TestContext *testCtx,GLenum name,bool reference0,bool reference1
          ,bool reference2,bool reference3)

{
  ostringstream *this_00;
  bool bVar1;
  StateQueryMemoryWriteGuard<int[4]> local_1e8;
  undefined1 local_1b0 [384];
  
  local_1e8.m_postguard[0] = -0x21212122;
  local_1e8.m_postguard[1] = -0x21212122;
  local_1e8.m_postguard[2] = -0x21212122;
  local_1e8.m_postguard[3] = -0x21212122;
  local_1e8.m_value[0] = -0x21212122;
  local_1e8.m_value[1] = -0x21212122;
  local_1e8.m_value[2] = -0x21212122;
  local_1e8.m_value[3] = -0x21212122;
  local_1e8.m_preguard[0] = -0x21212122;
  local_1e8.m_preguard[1] = -0x21212122;
  local_1e8.m_preguard[2] = -0x21212122;
  local_1e8.m_preguard[3] = -0x21212122;
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,local_1e8.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[4]>::verifyValidity
                    (&local_1e8,testCtx);
  if (bVar1) {
    if ((((local_1e8.m_value[0] != (uint)reference0) || (local_1e8.m_value[1] != (uint)reference1))
        || (local_1e8.m_value[2] != (uint)reference2)) || (local_1e8.m_value[3] != (uint)reference3)
       ) {
      local_1b0._0_8_ = testCtx->m_log;
      this_00 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"// ERROR: expected ",0x13);
      std::ostream::operator<<(this_00,(uint)reference0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
      std::ostream::operator<<(this_00,(uint)reference1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
      std::ostream::operator<<(this_00,(uint)reference2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
      std::ostream::operator<<(this_00,(uint)reference3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
      if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid integer value");
      }
    }
  }
  return;
}

Assistant:

void GetIntegerVerifier::verifyBoolean4 (tcu::TestContext& testCtx, GLenum name, bool reference0, bool reference1, bool reference2, bool reference3)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLint[4]> boolVector4;
	glGetIntegerv(name, boolVector4);

	if (!boolVector4.verifyValidity(testCtx))
		return;

	const GLint referenceAsGLint[] =
	{
		reference0 ? 1 : 0,
		reference1 ? 1 : 0,
		reference2 ? 1 : 0,
		reference3 ? 1 : 0,
	};

	if (boolVector4[0] != referenceAsGLint[0] ||
		boolVector4[1] != referenceAsGLint[1] ||
		boolVector4[2] != referenceAsGLint[2] ||
		boolVector4[3] != referenceAsGLint[3])
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected "
			<< referenceAsGLint[0] << " "
			<< referenceAsGLint[1] << " "
			<< referenceAsGLint[2] << " "
			<< referenceAsGLint[3] << " " << TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid integer value");
	}
}